

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall
t_php_generator::generate_php_struct_reader
          (t_php_generator *this,ostream *out,t_struct *tstruct,bool is_result)

{
  int *piVar1;
  bool bVar2;
  pointer pptVar3;
  t_field *tfield;
  t_type *ptVar4;
  const_iterator f_iter;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pptVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  t_field fftype;
  t_field ffid;
  string local_290;
  string local_270;
  t_field local_250;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  t_field local_e0;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public function read($input)",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  if (this->oop_ != true) {
    t_generator::indent_abi_cxx11_((string *)&local_250,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_250.super_t_doc._vptr_t_doc,
                        (long)local_250.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$xfer = 0;",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_e0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_e0.super_t_doc._vptr_t_doc,
                        (long)local_e0.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$fname = null;",0xe);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$ftype = 0;",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_290._M_dataplus._M_p,local_290._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$fid = 0;",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if (local_e0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_e0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_e0.super_t_doc._vptr_t_doc);
    }
    if (local_250.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_250.super_t_doc.doc_._M_string_length) {
      operator_delete(local_250.super_t_doc._vptr_t_doc);
    }
    if (this->binary_inline_ == false) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"$xfer += $input->readStructBegin($fname);",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"while (true) {",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    ptVar4 = g_type_i8;
    if (this->binary_inline_ == true) {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"ftype","");
      t_field::t_field(&local_250,ptVar4,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      ptVar4 = g_type_i16;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"fid","");
      t_field::t_field(&local_e0,ptVar4,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      generate_deserialize_field(this,out,&local_250,&local_140,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_270._M_dataplus._M_p,local_270._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if ($ftype == ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"TType::STOP) {",0xe);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  break;",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_160._M_dataplus._M_p,local_160._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
      generate_deserialize_field(this,out,&local_e0,&local_180,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      t_field::~t_field(&local_e0);
      t_field::~t_field(&local_250);
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"$xfer += $input->readFieldBegin($fname, $ftype, $fid);",0x36);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if ($ftype == ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"TType::STOP) {",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"break;",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"switch ($fid) {",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar6 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"case ",5);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*pptVar6)->key_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar5 = t_generator::indent((t_generator *)this,out);
        pcVar9 = "if ($ftype == ";
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if ($ftype == ",0xe);
        type_to_enum_abi_cxx11_((string *)&local_250,(t_php_generator *)pcVar9,(*pptVar6)->type_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_250.super_t_doc._vptr_t_doc,
                            (long)local_250.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") {",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if (local_250.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_250.super_t_doc.doc_._M_string_length) {
          operator_delete(local_250.super_t_doc._vptr_t_doc);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        tfield = *pptVar6;
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"this->","");
        generate_deserialize_field(this,out,tfield,&local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_((string *)&local_250,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(char *)local_250.super_t_doc._vptr_t_doc,
                            (long)local_250.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} else {",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if (local_250.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_250.super_t_doc.doc_._M_string_length) {
          operator_delete(local_250.super_t_doc._vptr_t_doc);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        bVar2 = this->binary_inline_;
        poVar5 = t_generator::indent((t_generator *)this,out);
        if (bVar2 == true) {
          lVar8 = 0x2f;
          pcVar9 = "$xfer += TProtocol::skipBinary($input, $ftype);";
        }
        else {
          lVar8 = 0x1e;
          pcVar9 = "$xfer += $input->skip($ftype);";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_((string *)&local_250,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(char *)local_250.super_t_doc._vptr_t_doc,
                            (long)local_250.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_e0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_e0.super_t_doc._vptr_t_doc,
                            (long)local_e0.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"break;",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if (local_e0.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_e0.super_t_doc.doc_._M_string_length) {
          operator_delete(local_e0.super_t_doc._vptr_t_doc);
        }
        if (local_250.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_250.super_t_doc.doc_._M_string_length) {
          operator_delete(local_250.super_t_doc._vptr_t_doc);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        pptVar6 = pptVar6 + 1;
      } while (pptVar6 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"default:",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    bVar2 = this->binary_inline_;
    poVar5 = t_generator::indent((t_generator *)this,out);
    if (bVar2 == true) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$xfer += ",9);
      pcVar9 = "TProtocol::skipBinary($input, $ftype);";
      lVar8 = 0x26;
    }
    else {
      pcVar9 = "$xfer += $input->skip($ftype);";
      lVar8 = 0x1e;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"break;",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    if (this->binary_inline_ == false) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"$xfer += $input->readFieldEnd();",0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    if (this->binary_inline_ == false) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"$xfer += $input->readStructEnd();",0x21);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if (this->validate_ == true && !is_result) {
      pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pptVar3 != pptVar6) {
        iVar7 = 0;
        do {
          iVar7 = iVar7 + (uint)((*pptVar6)->req_ == T_REQUIRED);
          pptVar6 = pptVar6 + 1;
        } while (pptVar6 != pptVar3);
        if (iVar7 != 0) {
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"$this->_validateForRead();",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
      }
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return $xfer;",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_((string *)&local_250,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_250.super_t_doc._vptr_t_doc,
                        (long)local_250.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_250.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_250.super_t_doc.doc_._M_string_length) {
      operator_delete(local_250.super_t_doc._vptr_t_doc);
    }
    return;
  }
  if (this->validate_ == true && !is_result) {
    pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pptVar3 != pptVar6) {
      iVar7 = 0;
      do {
        iVar7 = iVar7 + (uint)((*pptVar6)->req_ == T_REQUIRED);
        pptVar6 = pptVar6 + 1;
      } while (pptVar6 != pptVar3);
      if (iVar7 != 0) {
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$tmp = $this->_read(\'",0x15);
        iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,*(char **)CONCAT44(extraout_var,iVar7),
                            ((undefined8 *)CONCAT44(extraout_var,iVar7))[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\', self::$_TSPEC, $input);",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$this->_validateForRead();",0x1a)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar5 = t_generator::indent((t_generator *)this,out);
        pcVar9 = "return $tmp;";
        lVar8 = 0xc;
        goto LAB_002f9e7d;
      }
    }
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return $this->_read(\'",0x15);
  iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var_00,iVar7),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar7))[1]);
  pcVar9 = "\', self::$_TSPEC, $input);";
  lVar8 = 0x1a;
LAB_002f9e7d:
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_php_generator::generate_php_struct_reader(ostream& out, t_struct* tstruct, bool is_result) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "public function read($input)" << endl;
  scope_up(out);

  if (oop_) {
    if (needs_php_read_validator(tstruct, is_result)) {
      indent(out) << "$tmp = $this->_read('" << tstruct->get_name() << "', self::$_TSPEC, $input);"
                  << endl;
      indent(out) << "$this->_validateForRead();" << endl;
      indent(out) << "return $tmp;" << endl;
    } else {
      indent(out) << "return $this->_read('" << tstruct->get_name() << "', self::$_TSPEC, $input);"
                  << endl;
    }
    scope_down(out);
    out << endl;
    return;
  }

  out << indent() << "$xfer = 0;" << endl << indent() << "$fname = null;" << endl << indent()
      << "$ftype = 0;" << endl << indent() << "$fid = 0;" << endl;

  // Declare stack tmp variables
  if (!binary_inline_) {
    indent(out) << "$xfer += $input->readStructBegin($fname);" << endl;
  }

  // Loop over reading in fields
  indent(out) << "while (true) {" << endl;

  indent_up();

  // Read beginning field marker
  if (binary_inline_) {
    t_field fftype(g_type_i8, "ftype");
    t_field ffid(g_type_i16, "fid");
    generate_deserialize_field(out, &fftype);
    out << indent() << "if ($ftype == "
        << "TType::STOP) {" << endl << indent() << "  break;" << endl << indent() << "}" << endl;
    generate_deserialize_field(out, &ffid);
  } else {
    indent(out) << "$xfer += $input->readFieldBegin($fname, $ftype, $fid);" << endl;
    // Check for field STOP marker and break
    indent(out) << "if ($ftype == "
                << "TType::STOP) {" << endl;
    indent_up();
    indent(out) << "break;" << endl;
    indent_down();
    indent(out) << "}" << endl;
  }

  // Switch statement on the field we are reading
  indent(out) << "switch ($fid) {" << endl;

  indent_up();

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if ($ftype == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
    indent_up();
    generate_deserialize_field(out, *f_iter, "this->");
    indent_down();
    out << indent() << "} else {" << endl;

    indent_up();
    if (binary_inline_) {
      indent(out) << "$xfer += TProtocol::skipBinary($input, $ftype);" << endl;
    } else {
      indent(out) << "$xfer += $input->skip($ftype);" << endl;
    }

    indent_down();
    out << indent() << "}" << endl << indent() << "break;" << endl;
    indent_down();
  }

  // In the default case we skip the field
  indent(out) << "default:" << endl;

  indent_up();
  if (binary_inline_) {
    indent(out) << "$xfer += "
                << "TProtocol::skipBinary($input, $ftype);" << endl;
  } else {
    indent(out) << "$xfer += $input->skip($ftype);" << endl;
  }
  indent(out) << "break;" << endl;
  indent_down();

  scope_down(out);

  if (!binary_inline_) {
    // Read field end marker
    indent(out) << "$xfer += $input->readFieldEnd();" << endl;
  }

  scope_down(out);

  if (!binary_inline_) {
    indent(out) << "$xfer += $input->readStructEnd();" << endl;
  }

  if (needs_php_read_validator(tstruct, is_result)) {
    indent(out) << "$this->_validateForRead();" << endl;
  }

  indent(out) << "return $xfer;" << endl;

  indent_down();
  out << indent() << "}" << endl;
}